

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::GetKingMoves<false,true>(Node *this,int depth)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint to;
  uint pc;
  uint from;
  uint from_00;
  ulong uVar14;
  int local_5c;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77d,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  if (*_KING != '\f') {
    __assert_fail("_KING[color]->type == (color|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77e,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  bVar1 = _KING[1];
  uVar14 = (ulong)bVar1;
  if ((bVar1 & 0x88) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x781,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  from = (uint)bVar1;
  if ((undefined *)(&_board)[uVar14] != _KING) {
    __assert_fail("_board[from] == _KING[color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x782,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  local_5c = 0;
  if (depth == 0) {
    local_5c = GetDiscoverDir(this,false,from);
  }
  uVar12 = *(ulong *)((long)&_queenKing + (ulong)((uint)bVar1 * 8 | 0x40));
  do {
    if (uVar12 == 0) {
      return;
    }
    if ((uVar12 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x78b,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    to = (int)(uVar12 & 0xff) - 1;
    iVar4 = Distance(from,to);
    if (iVar4 != 1) {
      __assert_fail("Distance(from, to) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x78d,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    iVar4 = Direction(from,to);
    from_00 = (uint)bVar1;
    iVar5 = Direction((uint)bVar1,to);
    iVar6 = Direction(from_00,to);
    iVar7 = Direction(from_00,to);
    iVar8 = Direction(from_00,to);
    iVar9 = Direction(from_00,to);
    iVar10 = Direction(from_00,to);
    iVar11 = Direction(from_00,to);
    if (((((iVar4 != -0x11) && (iVar5 != -0xf)) && (iVar6 != 0xf)) &&
        ((iVar7 != 0x11 && (iVar8 != -0x10)))) &&
       ((iVar9 != -1 && ((iVar10 != 1 && (iVar11 != 0x10)))))) {
      __assert_fail("IS_DIR(Direction(from, to))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x78e,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    uVar13 = (ulong)to;
    bVar2 = *(byte *)(&_board)[uVar13];
    if ((bVar2 == 0) && ((byte *)(&_board)[uVar13] != _EMPTY)) {
      __assert_fail("cap || (_board[to] == _EMPTY)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x791,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    pc = (uint)bVar2;
    if (pc == 0) {
      if (local_5c != 0) {
        iVar5 = Direction(from_00,to);
        iVar4 = -iVar5;
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        if (local_5c != iVar4) {
          bVar3 = AttackedBy<true>(to);
          if (!bVar3) {
            iVar4 = (*(int *)(_SQR + uVar13 * 4) - *(int *)(_SQR + uVar14 * 4)) + -10;
            pc = 0;
            goto LAB_0012d45f;
          }
        }
      }
    }
    else if ((bVar2 & 1) != 0) {
      bVar3 = AttackedBy<true>(to);
      if (!bVar3) {
        iVar4 = ValueOf(pc);
        iVar4 = ((iVar4 + *(int *)(_SQR + uVar13 * 4)) - *(int *)(_SQR + uVar14 * 4)) + -0x50;
LAB_0012d45f:
        AddMove(this,KingMove,(uint)bVar1,to,iVar4,pc,0);
      }
    }
    uVar12 = uVar12 >> 8;
  } while( true );
}

Assistant:

void GetKingMoves(const int depth) {
    assert(!checks);
    assert(_KING[color]->type == (color|King));

    const int from = _KING[color]->sqr;
    assert(IS_SQUARE(from));
    assert(_board[from] == _KING[color]);

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _queenKing[from + 8]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (qsearch) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (cap) {
          if ((COLOR(cap) != color) && !AttackedBy<!color>(to)) {
            score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
            AddMove(KingMove, from, to, score, cap);
          }
        }
        else if (kdir && (kdir != abs(Direction(from, to)))) {
          if (!AttackedBy<!color>(to)) {
            score = (_SQR[to] - _SQR[from] - 10);
            AddMove(KingMove, from, to, score);
          }
        }
      }
      else if (!AttackedBy<!color>(to)) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (!cap) {
          score = (_SQR[to] - _SQR[from] - 20);
          AddMove(KingMove, from, to, score);
          if ((to == (color ? F8 : F1)) &&
              (state & (color ? BlackShort : WhiteShort)) &&
              (_board[color ? G8 : G1] == _EMPTY) &&
              !AttackedBy<!color>(color ? G8 : G1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? H8 : H1]->type == (color|Rook));
            AddMove(CastleShort, from, (color ? G8 : G1), 50);
          }
          else if ((to == (color ? D8 : D1)) &&
                   (state & (color ? BlackLong : WhiteLong)) &&
                   (_board[color ? C8 : C1] == _EMPTY) &&
                   (_board[color ? B8 : B1] == _EMPTY) &&
                   !AttackedBy<!color>(color ? C8 : C1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? A8 : A1]->type == (color|Rook));
            AddMove(CastleLong, from, (color ? C8 : C1), 50);
          }
        }
        else if (COLOR(cap) != color) {
          score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
          AddMove(KingMove, from, to, score, cap);
        }
      }
    }
  }